

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equation-solver.cpp
# Opt level: O1

int msdfgen::solveCubicNormed(double *x,double a,double b,double c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = a * a;
  dVar5 = (b * -3.0 + dVar3) / 9.0;
  dVar4 = ((dVar3 + dVar3 + b * -9.0) * a + c * 27.0) / 54.0;
  dVar3 = dVar5 * dVar5 * dVar5;
  if (dVar3 <= dVar4 * dVar4) {
    dVar3 = dVar4 * dVar4 - dVar3;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar3 = pow(ABS(dVar4) + dVar3,0.3333333333333333);
    dVar4 = (double)(~-(ulong)(dVar4 < 0.0) & (ulong)-dVar3 | -(ulong)(dVar4 < 0.0) & (ulong)dVar3);
    dVar5 = (double)(~-(ulong)(-dVar3 == dVar3) & (ulong)(dVar5 / dVar4));
    dVar3 = dVar4 + dVar5;
    *x = dVar3 - a / 3.0;
    dVar5 = (dVar4 - dVar5) * 0.8660254037844386;
    x[1] = dVar3 * -0.5 - a / 3.0;
    x[2] = dVar5;
    iVar1 = 2;
    if (1e-14 <= ABS(dVar5)) {
      iVar1 = 1;
    }
  }
  else {
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar2 = -1.0;
    if (-1.0 <= dVar4 / dVar3) {
      dVar2 = dVar4 / dVar3;
    }
    dVar3 = 1.0;
    if (dVar2 <= 1.0) {
      dVar3 = dVar2;
    }
    dVar3 = acos(dVar3);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar5 = dVar5 * -2.0;
    dVar4 = cos(dVar3 / 3.0);
    dVar2 = a / -3.0;
    *x = dVar4 * dVar5 + dVar2;
    dVar4 = cos((dVar3 + 6.283185307179586) / 3.0);
    x[1] = dVar4 * dVar5 + dVar2;
    dVar3 = cos((dVar3 + -6.283185307179586) / 3.0);
    x[2] = dVar3 * dVar5 + dVar2;
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int solveCubicNormed(double *x, double a, double b, double c) {
    double a2 = a*a;
    double q  = (a2 - 3*b)/9; 
    double r  = (a*(2*a2-9*b) + 27*c)/54;
    double r2 = r*r;
    double q3 = q*q*q;
    double A, B;
    if (r2 < q3) {
        double t = r/sqrt(q3);
        if (t < -1) t = -1;
        if (t > 1) t = 1;
        t = acos(t);
        a /= 3; q = -2*sqrt(q);
        x[0] = q*cos(t/3)-a;
        x[1] = q*cos((t+2*M_PI)/3)-a;
        x[2] = q*cos((t-2*M_PI)/3)-a;
        return 3;
    } else {
        A = -pow(fabs(r)+sqrt(r2-q3), 1/3.); 
        if (r < 0) A = -A;
        B = A == 0 ? 0 : q/A;
        a /= 3;
        x[0] = (A+B)-a;
        x[1] = -0.5*(A+B)-a;
        x[2] = 0.5*sqrt(3.)*(A-B);
        if (fabs(x[2]) < 1e-14)
            return 2;
        return 1;
    }
}